

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O2

uint32_t __thiscall CompressedArray::calculate_value_size(CompressedArray *this,Value value)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  CompressedArray *pCVar4;
  undefined8 local_30;
  uint32_t local_28 [2];
  
  local_28[0] = value.unique_continuations_count;
  local_30 = value._0_8_;
  pCVar4 = (CompressedArray *)&this->ngram_count_values;
  uVar1 = Vocabulary<unsigned_int>::get_index((Vocabulary<unsigned_int> *)pCVar4,(uint *)&local_30);
  uVar1 = calculate_number_size(pCVar4,uVar1,this->ngram_count_index_log_radix);
  pCVar4 = (CompressedArray *)&this->continuations_count_values;
  uVar2 = Vocabulary<unsigned_int>::get_index
                    ((Vocabulary<unsigned_int> *)pCVar4,(uint *)((long)&local_30 + 4));
  uVar2 = calculate_number_size(pCVar4,uVar2,this->continuations_count_index_log_radix);
  pCVar4 = (CompressedArray *)&this->unique_continuations_count_values;
  uVar3 = Vocabulary<unsigned_int>::get_index((Vocabulary<unsigned_int> *)pCVar4,local_28);
  uVar3 = calculate_number_size(pCVar4,uVar3,this->unique_continuations_count_index_log_radix);
  return uVar3 + uVar2 + uVar1;
}

Assistant:

uint32_t CompressedArray::calculate_value_size(Value value) const {
    uint32_t size = 0;
    uint32_t index = ngram_count_values.get_index(value.ngram_count);
    size += calculate_number_size(index, ngram_count_index_log_radix);
    index = continuations_count_values.get_index(value.continuations_count);
    size += calculate_number_size(index, continuations_count_index_log_radix);
    index = unique_continuations_count_values.get_index(value.unique_continuations_count);
    size += calculate_number_size(index, unique_continuations_count_index_log_radix);
    return size;
}